

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception-test.c++
# Opt level: O2

void __thiscall kj::_::anon_unknown_0::TestCase59::run(TestCase59 *this)

{
  logic_error *this_00;
  DebugComparison<const_char_(&)[20],_kj::StringPtr> _kjCondition;
  Maybe<kj::Exception> e;
  
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  ::std::logic_error::logic_error(this_00,"foo");
  __cxa_throw(this_00,&::std::logic_error::typeinfo,::std::logic_error::~logic_error);
}

Assistant:

TEST(Exception, RunCatchingExceptionsStdException) {
  Maybe<Exception> e = kj::runCatchingExceptions([&]() {
    throw std::logic_error("foo");
  });

  KJ_IF_SOME(ex, e) {
    EXPECT_EQ("std::exception: foo", ex.getDescription());
  } else {
    ADD_FAILURE() << "Expected exception";
  }